

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::localError
          (CommonCore *this,LocalFederateId federateID,int errorCode,string_view errorString)

{
  string_view message;
  undefined1 uVar1;
  bool bVar2;
  FederateStates FVar3;
  GlobalFederateId GVar4;
  FederateState *this_00;
  undefined8 uVar5;
  char *in_RDI;
  MessageProcessingResult ret;
  ActionMessage error;
  FederateState *fed;
  undefined2 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffeca;
  undefined1 in_stack_fffffffffffffecb;
  undefined1 in_stack_fffffffffffffecc;
  undefined1 in_stack_fffffffffffffecd;
  undefined1 in_stack_fffffffffffffece;
  FederateState *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  MessageProcessingResult MVar6;
  undefined4 in_stack_fffffffffffffee8;
  action_t in_stack_fffffffffffffeec;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_fffffffffffffef8;
  GlobalFederateId in_stack_ffffffffffffff08;
  InterfaceHandle in_stack_ffffffffffffff0c;
  LocalFederateId in_stack_ffffffffffffff14;
  
  this_00 = getFederateAt((CommonCore *)
                          CONCAT44(in_stack_ffffffffffffff0c.hid,in_stack_ffffffffffffff08.gid),
                          in_stack_ffffffffffffff14);
  if (this_00 == (FederateState *)0x0) {
    uVar5 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),in_RDI);
    message._M_len._4_4_ = in_stack_fffffffffffffeec;
    message._M_len._0_4_ = in_stack_fffffffffffffee8;
    message._M_str._0_7_ = in_stack_fffffffffffffef0;
    message._M_str._7_1_ = in_stack_fffffffffffffef7;
    InvalidIdentifier::InvalidIdentifier
              ((InvalidIdentifier *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               message);
    __cxa_throw(uVar5,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffeec);
  GVar4 = std::atomic<helics::GlobalFederateId>::load(&this_00->global_id,seq_cst);
  SmallBuffer::operator=
            ((SmallBuffer *)CONCAT44(GVar4.gid,in_stack_fffffffffffffef8),
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  uVar1 = FederateState::isCallbackFederate(this_00);
  if ((bool)uVar1) {
    setActionFlag<helics::ActionMessage,helics::GeneralFlags>
              ((ActionMessage *)&stack0xffffffffffffff00,indicator_flag);
  }
  BrokerBase::addActionMessage
            ((BrokerBase *)in_stack_fffffffffffffed0,
             (ActionMessage *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffece,
                                     CONCAT15(in_stack_fffffffffffffecd,
                                              CONCAT14(in_stack_fffffffffffffecc,
                                                       CONCAT13(in_stack_fffffffffffffecb,
                                                                CONCAT12(in_stack_fffffffffffffeca,
                                                                         in_stack_fffffffffffffec8))
                                                      )))));
  bVar2 = FederateState::isCallbackFederate(this_00);
  if (!bVar2) {
    FederateState::addAction
              (in_stack_fffffffffffffed0,
               (ActionMessage *)
               CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(in_stack_fffffffffffffecd,
                                                      CONCAT14(in_stack_fffffffffffffecc,
                                                               CONCAT13(in_stack_fffffffffffffecb,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffeca,
                                                  in_stack_fffffffffffffec8)))))));
    MVar6 = NEXT_STEP;
    while (((MVar6 != ERROR_RESULT &&
            (FVar3 = FederateState::getState((FederateState *)0x462789), FVar3 != FINISHED)) &&
           (FVar3 = FederateState::getState((FederateState *)0x4627a4), FVar3 != ERRORED))) {
      MVar6 = FederateState::genericUnspecifiedQueueProcess
                        ((FederateState *)CONCAT44(GVar4.gid,in_stack_fffffffffffffef8),
                         (bool)in_stack_fffffffffffffef7);
      if (((MVar6 == HALTED) || (MVar6 == ERROR_RESULT)) || (MVar6 == BUSY)) break;
    }
  }
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffed0);
  return;
}

Assistant:

void CommonCore::localError(LocalFederateId federateID, int errorCode, std::string_view errorString)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid error"));
    }
    ActionMessage error(CMD_LOCAL_ERROR);
    error.source_id = fed->global_id.load();
    error.messageID = errorCode;
    error.payload = errorString;
    if (fed->isCallbackFederate()) {
        setActionFlag(error, indicator_flag);
    }
    addActionMessage(error);
    if (fed->isCallbackFederate()) {
        return;
    }
    fed->addAction(error);
    MessageProcessingResult ret = MessageProcessingResult::NEXT_STEP;
    while (ret != MessageProcessingResult::ERROR_RESULT) {
        if (fed->getState() == FederateStates::FINISHED ||
            fed->getState() == FederateStates::ERRORED) {
            return;
        }
        ret = fed->genericUnspecifiedQueueProcess(false);
        switch (ret) {
            case MessageProcessingResult::ERROR_RESULT:
            case MessageProcessingResult::HALTED:
            case MessageProcessingResult::BUSY:
                return;
            default:
                break;
        }
    }
}